

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void hadamard_lp_8x8_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 *puVar17;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  __m128i src [8];
  int iter;
  __m128i *in_stack_fffffffffffffea8;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  puVar17 = (undefined8 *)(in_RSI * 2 + (long)in_RDI);
  uVar3 = *puVar17;
  uVar4 = puVar17[1];
  puVar17 = (undefined8 *)(in_RSI * 2 + (long)puVar17);
  uVar5 = *puVar17;
  uVar6 = puVar17[1];
  puVar17 = (undefined8 *)(in_RSI * 2 + (long)puVar17);
  uVar7 = *puVar17;
  uVar8 = puVar17[1];
  puVar17 = (undefined8 *)(in_RSI * 2 + (long)puVar17);
  uVar9 = *puVar17;
  uVar10 = puVar17[1];
  puVar17 = (undefined8 *)(in_RSI * 2 + (long)puVar17);
  uVar11 = *puVar17;
  uVar12 = puVar17[1];
  puVar17 = (undefined8 *)(in_RSI * 2 + (long)puVar17);
  uVar13 = *puVar17;
  uVar14 = puVar17[1];
  puVar17 = (undefined8 *)((long)puVar17 + in_RSI * 2);
  uVar15 = *puVar17;
  uVar16 = puVar17[1];
  iter = (int)((ulong)uVar16 >> 0x20);
  hadamard_col8_sse2(in_stack_fffffffffffffea8,iter);
  hadamard_col8_sse2(in_stack_fffffffffffffea8,iter);
  *in_RDX = uVar1;
  in_RDX[1] = uVar2;
  in_RDX[2] = uVar3;
  in_RDX[3] = uVar4;
  in_RDX[4] = uVar5;
  in_RDX[5] = uVar6;
  in_RDX[6] = uVar7;
  in_RDX[7] = uVar8;
  in_RDX[8] = uVar9;
  in_RDX[9] = uVar10;
  in_RDX[10] = uVar11;
  in_RDX[0xb] = uVar12;
  in_RDX[0xc] = uVar13;
  in_RDX[0xd] = uVar14;
  in_RDX[0xe] = uVar15;
  in_RDX[0xf] = uVar16;
  return;
}

Assistant:

static inline void hadamard_lp_8x8_sse2(const int16_t *src_diff,
                                        ptrdiff_t src_stride, int16_t *coeff) {
  __m128i src[8];
  src[0] = _mm_load_si128((const __m128i *)src_diff);
  src[1] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[4] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[5] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[6] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[7] = _mm_load_si128((const __m128i *)(src_diff + src_stride));

  hadamard_col8_sse2(src, 0);
  hadamard_col8_sse2(src, 1);

  _mm_store_si128((__m128i *)coeff, src[0]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[1]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[2]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[3]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[4]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[5]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[6]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[7]);
}